

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

void __thiscall
duckdb::CSVReaderOptions::CSVReaderOptions
          (CSVReaderOptions *this,CSVOption<char> single_byte_delimiter,
          CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *multi_byte_delimiter)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_> __l_01;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_bool>_> __l_02;
  string value;
  allocator_type local_28a;
  less<duckdb::LogicalTypeId> local_289;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  string *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  string *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  Value local_218;
  LogicalType local_1d8;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  LogicalType local_160;
  undefined1 local_148 [8];
  undefined1 local_140 [40];
  LogicalType local_118;
  undefined1 local_100 [24];
  LogicalType local_e8;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  LogicalType local_88;
  Value local_70;
  
  DialectOptions::DialectOptions(&this->dialect_options);
  (this->ignore_errors).set_by_user = false;
  (this->ignore_errors).value = false;
  (this->store_rejects).set_by_user = false;
  (this->store_rejects).value = false;
  local_180 = local_170;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"reject_errors","");
  (this->rejects_table_name).set_by_user = false;
  pbVar1 = &(this->rejects_table_name).value;
  paVar2 = &(this->rejects_table_name).value.field_2;
  (this->rejects_table_name).value._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>((string *)pbVar1,local_180,local_180 + local_178);
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  local_228 = paVar2;
  local_220 = pbVar1;
  local_1a0 = local_190;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"reject_scans","");
  (this->rejects_scan_name).set_by_user = false;
  local_230 = &(this->rejects_scan_name).value;
  local_238 = &(this->rejects_scan_name).value.field_2;
  (this->rejects_scan_name).value._M_dataplus._M_p = (pointer)local_238;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_230,local_1a0,local_1a0 + local_198);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  this->rejects_limit = 0;
  this->buffer_sample_size = 0x19000;
  local_148 = (undefined1  [8])(local_140 + 8);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,anon_var_dwarf_63f17de + 9);
  local_240 = &this->null_str;
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_240,__l,(allocator_type *)&local_218);
  if (local_148 != (undefined1  [8])(local_140 + 8)) {
    operator_delete((void *)local_148);
  }
  this->compression = AUTO_DETECT;
  this->allow_quoted_nulls = true;
  this->comment = '\0';
  (this->sql_types_per_column)._M_h._M_buckets = &(this->sql_types_per_column)._M_h._M_single_bucket
  ;
  (this->sql_types_per_column)._M_h._M_bucket_count = 1;
  (this->sql_types_per_column)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sql_types_per_column)._M_h._M_element_count = 0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sql_types_per_column)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->columns_set = false;
  LogicalType::LogicalType((LogicalType *)local_148,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_140 + 0x10),DOUBLE);
  LogicalType::LogicalType(&local_118,BIGINT);
  LogicalType::LogicalType((LogicalType *)local_100,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_e8,TIMESTAMP);
  LogicalType::LogicalType(&local_d0,DATE);
  LogicalType::LogicalType(&local_b8,TIME);
  LogicalType::LogicalType(&local_a0,BOOLEAN);
  LogicalType::LogicalType(&local_88,SQLNULL);
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_148;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->auto_type_candidates,__l_00,(allocator_type *)&local_218);
  lVar4 = 0xc0;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_148 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_288 = &(this->sniffer_user_mismatch_error).field_2;
  (this->sniffer_user_mismatch_error)._M_dataplus._M_p = (pointer)local_288;
  (this->sniffer_user_mismatch_error)._M_string_length = 0;
  (this->sniffer_user_mismatch_error).field_2._M_local_buf[0] = '\0';
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->maximum_line_size).set_by_user = false;
  (this->maximum_line_size).value = 2000000;
  this->normalize_names = false;
  (this->force_not_null_names)._M_h._M_buckets = &(this->force_not_null_names)._M_h._M_single_bucket
  ;
  (this->force_not_null_names)._M_h._M_bucket_count = 1;
  (this->force_not_null_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->force_not_null_names)._M_h._M_element_count = 0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->force_not_null_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->force_not_null_names)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)
   ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 4) = 0;
  this->sample_size_chunks = 10;
  this->all_varchar = false;
  this->auto_detect = true;
  local_248 = &(this->file_path).field_2;
  (this->file_path)._M_dataplus._M_p = (pointer)local_248;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_option).set_by_user = false;
  (this->buffer_size_option).value = 32000000;
  local_268 = &this->decimal_separator;
  local_270 = &(this->decimal_separator).field_2;
  (this->decimal_separator)._M_dataplus._M_p = (pointer)local_270;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,".","");
  this->null_padding = false;
  this->parallel = true;
  local_278 = &this->encoding;
  local_280 = &(this->encoding).field_2;
  (this->encoding)._M_dataplus._M_p = (pointer)local_280;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"utf-8","");
  p_Var3 = &(this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  local_250 = &(this->prefix).field_2;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->prefix)._M_dataplus._M_p = (pointer)local_250;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  local_258 = &(this->suffix).field_2;
  (this->suffix)._M_dataplus._M_p = (pointer)local_258;
  (this->suffix)._M_string_length = 0;
  (this->suffix).field_2._M_local_buf[0] = '\0';
  local_260 = &(this->write_newline).field_2;
  (this->write_newline)._M_dataplus._M_p = (pointer)local_260;
  (this->write_newline)._M_string_length = 0;
  (this->write_newline).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_1d8,SQLNULL);
  Value::Value(&local_218,&local_1d8);
  local_148[0] = (string)0xf;
  Value::Value((Value *)local_140,&local_218);
  LogicalType::LogicalType(&local_160,SQLNULL);
  Value::Value(&local_70,&local_160);
  local_100[0] = TIMESTAMP;
  Value::Value((Value *)(local_100 + 8),&local_70);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_148;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::map(&this->write_date_format,__l_01,&local_289,&local_28a);
  lVar4 = 0x50;
  do {
    Value::~Value((Value *)(local_148 + lVar4));
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  Value::~Value(&local_70);
  LogicalType::~LogicalType(&local_160);
  Value::~Value(&local_218);
  LogicalType::~LogicalType(&local_1d8);
  local_148._0_4_ = 0x13000f;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_148;
  ::std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::map(&this->has_format,__l_02,(less<duckdb::LogicalTypeId> *)&local_218,
        (allocator_type *)&local_70);
  this->multi_file_reader = false;
  if ((multi_byte_delimiter->value)._M_string_length == 0) {
    local_218.type_._0_8_ =
         &local_218.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct((ulong)&local_218,'\x01');
    local_1c0 = local_1b0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,local_218.type_._0_8_,
               (long)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_218.type_._0_8_ +
               (long)&(local_218.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->_vptr_ExtraTypeInfo);
    local_148 = (undefined1  [8])((ulong)local_148 & 0xffffffffffffff00);
    local_140._0_8_ = (element_type *)(local_140 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>((string *)local_140,local_1c0,local_1c0 + local_1b8)
    ;
    (this->dialect_options).state_machine_options.delimiter.set_by_user = (bool)local_148[0];
    ::std::__cxx11::string::operator=
              ((string *)&(this->dialect_options).state_machine_options.delimiter.value,
               (string *)local_140);
    if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
      operator_delete((void *)local_140._0_8_);
    }
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_218.type_._0_8_ !=
        &local_218.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_218.type_._0_8_);
    }
  }
  else {
    (this->dialect_options).state_machine_options.delimiter.set_by_user =
         multi_byte_delimiter->set_by_user;
    ::std::__cxx11::string::_M_assign
              ((string *)&(this->dialect_options).state_machine_options.delimiter.value);
  }
  return;
}

Assistant:

CSVReaderOptions::CSVReaderOptions(const CSVOption<char> single_byte_delimiter,
                                   const CSVOption<string> &multi_byte_delimiter) {
	if (multi_byte_delimiter.GetValue().empty()) {
		const char single_byte_value = single_byte_delimiter.GetValue();
		const string value(1, single_byte_value);
		dialect_options.state_machine_options.delimiter = value;
	} else {
		dialect_options.state_machine_options.delimiter = multi_byte_delimiter;
	}
}